

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  byte bVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  cJSON_bool cVar8;
  lconv *plVar9;
  long lVar10;
  ulong uVar11;
  cJSON *item_00;
  cJSON_bool cVar12;
  byte bVar13;
  uint uVar14;
  cJSON *pcVar15;
  cJSON *item_01;
  cJSON *pcVar16;
  long in_FS_OFFSET;
  double dVar17;
  uchar *after_end;
  byte *local_80;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar12 = 0;
  cVar8 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar3 = input_buffer->content, cVar8 = cVar12, puVar3 != (uchar *)0x0)) {
    uVar4 = input_buffer->length;
    uVar5 = input_buffer->offset;
    uVar11 = uVar5 + 4;
    if ((uVar4 < uVar11) || (iVar7 = strncmp((char *)(puVar3 + uVar5),"null",4), iVar7 != 0)) {
      if ((uVar4 < uVar5 + 5) || (iVar7 = strncmp((char *)(puVar3 + uVar5),"false",5), iVar7 != 0))
      {
        if ((uVar4 < uVar11) || (iVar7 = strncmp((char *)(puVar3 + uVar5),"true",4), iVar7 != 0)) {
          if (uVar5 < uVar4) {
            uVar1 = puVar3[uVar5];
            if (uVar1 == '\"') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                cVar8 = parse_string(item,input_buffer);
                return cVar8;
              }
              goto LAB_00103958;
            }
            if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
              local_80 = (byte *)0x0;
              plVar9 = localeconv();
              puVar3 = input_buffer->content;
              if (puVar3 != (uchar *)0x0) {
                bVar2 = *plVar9->decimal_point;
                uVar11 = input_buffer->length;
                sVar6 = input_buffer->offset;
                lVar10 = 0;
                do {
                  if ((uVar11 <= sVar6 + lVar10) ||
                     ((bVar13 = puVar3[lVar10 + sVar6], 9 < bVar13 - 0x30 &&
                      ((uVar14 = bVar13 - 0x2b, 0x3a < uVar14 ||
                       (((0x400000004000005U >> ((ulong)uVar14 & 0x3f) & 1) == 0 &&
                        (bVar13 = bVar2, (ulong)uVar14 != 3)))))))) goto LAB_00103832;
                  local_78[lVar10] = bVar13;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0x3f);
                lVar10 = 0x3f;
LAB_00103832:
                local_78[lVar10] = 0;
                dVar17 = strtod((char *)local_78,(char **)&local_80);
                if (local_78 != local_80) {
                  item->valuedouble = dVar17;
                  iVar7 = 0x7fffffff;
                  if ((dVar17 < 2147483647.0) && (iVar7 = -0x80000000, -2147483648.0 < dVar17)) {
                    iVar7 = (int)dVar17;
                  }
                  item->valueint = iVar7;
                  item->type = 8;
                  input_buffer->offset =
                       (size_t)(local_80 + (input_buffer->offset - (long)local_78));
                  goto LAB_00103763;
                }
              }
LAB_0010394a:
              cVar8 = 0;
            }
            else {
              if (uVar1 == '{') {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  cVar8 = parse_object(item,input_buffer);
                  return cVar8;
                }
                goto LAB_00103958;
              }
              if (((uVar1 == '[') && (input_buffer->depth < 1000)) &&
                 (input_buffer->depth = input_buffer->depth + 1, puVar3[uVar5] == '[')) {
                input_buffer->offset = uVar5 + 1;
                buffer_skip_whitespace(input_buffer);
                uVar11 = input_buffer->offset;
                if (uVar11 < input_buffer->length) {
                  if (input_buffer->content[uVar11] == ']') {
                    item_01 = (cJSON *)0x0;
                  }
                  else {
                    input_buffer->offset = uVar11 - 1;
                    pcVar15 = (cJSON *)0x0;
                    pcVar16 = (cJSON *)0x0;
                    do {
                      item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
                      if (item_00 == (cJSON *)0x0) {
                        item_01 = pcVar16;
                        if (pcVar16 == (cJSON *)0x0) goto LAB_0010394a;
                        goto LAB_00103942;
                      }
                      item_00->valuedouble = 0.0;
                      item_00->string = (char *)0x0;
                      item_00->valuestring = (char *)0x0;
                      *(undefined8 *)&item_00->valueint = 0;
                      item_00->child = (cJSON *)0x0;
                      *(undefined8 *)&item_00->type = 0;
                      item_00->next = (cJSON *)0x0;
                      item_00->prev = (cJSON *)0x0;
                      item_01 = item_00;
                      if (pcVar16 != (cJSON *)0x0) {
                        pcVar15->next = item_00;
                        item_00->prev = pcVar15;
                        item_01 = pcVar16;
                      }
                      input_buffer->offset = input_buffer->offset + 1;
                      buffer_skip_whitespace(input_buffer);
                      cVar8 = parse_value(item_00,input_buffer);
                      if (cVar8 == 0) goto LAB_00103942;
                      buffer_skip_whitespace(input_buffer);
                      uVar11 = input_buffer->offset;
                      if (input_buffer->length <= uVar11) goto LAB_00103942;
                      pcVar15 = item_00;
                      pcVar16 = item_01;
                    } while (input_buffer->content[uVar11] == ',');
                    if (input_buffer->content[uVar11] != ']') {
LAB_00103942:
                      cJSON_Delete(item_01);
                      goto LAB_0010394a;
                    }
                  }
                  input_buffer->depth = input_buffer->depth - 1;
                  item->type = 0x20;
                  item->child = item_01;
                  input_buffer->offset = uVar11 + 1;
                  goto LAB_00103763;
                }
                input_buffer->offset = uVar11 - 1;
              }
            }
          }
          goto LAB_00103768;
        }
        item->type = 2;
        item->valueint = 1;
        input_buffer->offset = uVar11;
      }
      else {
        item->type = 1;
        input_buffer->offset = uVar5 + 5;
      }
    }
    else {
      item->type = 4;
      input_buffer->offset = uVar11;
    }
LAB_00103763:
    cVar8 = 1;
  }
LAB_00103768:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar8;
  }
LAB_00103958:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}